

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

int __thiscall ImGuiStorage::GetInt(ImGuiStorage *this,ImGuiID key,int default_val)

{
  Pair *pPVar1;
  Pair *pPVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = (this->Data).Size;
  lVar3 = (long)(int)uVar5;
  pPVar1 = (this->Data).Data;
  pPVar2 = pPVar1;
  if (0 < lVar3) {
    do {
      uVar4 = uVar5 >> 1;
      if (pPVar2[uVar4].key < key) {
        pPVar2 = pPVar2 + (ulong)uVar4 + 1;
        uVar4 = uVar5 + ~uVar4;
      }
      uVar5 = uVar4;
    } while (0 < (int)uVar5);
  }
  if ((pPVar2 != pPVar1 + lVar3) && (pPVar2->key == key)) {
    default_val = (pPVar2->field_1).val_i;
  }
  return default_val;
}

Assistant:

int ImGuiStorage::GetInt(ImGuiID key, int default_val) const
{
    ImVector<Pair>::iterator it = LowerBound(const_cast<ImVector<ImGuiStorage::Pair>&>(Data), key);
    if (it == Data.end() || it->key != key)
        return default_val;
    return it->val_i;
}